

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O0

char * Saig_ObjName(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsNode(pObj);
  if ((iVar1 == 0) && (iVar1 = Aig_ObjIsConst1(pObj), iVar1 == 0)) {
    iVar1 = Saig_ObjIsPi(p,pObj);
    if (iVar1 == 0) {
      iVar1 = Saig_ObjIsPo(p,pObj);
      if (iVar1 == 0) {
        iVar1 = Saig_ObjIsLo(p,pObj);
        if (iVar1 == 0) {
          iVar1 = Saig_ObjIsLi(p,pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIoa.c"
                          ,0x3c,"char *Saig_ObjName(Aig_Man_t *, Aig_Obj_t *)");
          }
          uVar2 = Saig_ManRegNum(p);
          uVar2 = Abc_Base10Log(uVar2);
          iVar1 = Aig_ObjCioId(pObj);
          iVar4 = Saig_ManPoNum(p);
          sprintf(Saig_ObjName::Buffer,"li%0*d",(ulong)uVar2,(ulong)(uint)(iVar1 - iVar4));
        }
        else {
          uVar2 = Saig_ManRegNum(p);
          uVar2 = Abc_Base10Log(uVar2);
          iVar1 = Aig_ObjCioId(pObj);
          iVar4 = Saig_ManPiNum(p);
          sprintf(Saig_ObjName::Buffer,"lo%0*d",(ulong)uVar2,(ulong)(uint)(iVar1 - iVar4));
        }
      }
      else {
        uVar2 = Saig_ManPoNum(p);
        uVar2 = Abc_Base10Log(uVar2);
        uVar3 = Aig_ObjCioId(pObj);
        sprintf(Saig_ObjName::Buffer,"po%0*d",(ulong)uVar2,(ulong)uVar3);
      }
    }
    else {
      uVar2 = Saig_ManPiNum(p);
      uVar2 = Abc_Base10Log(uVar2);
      uVar3 = Aig_ObjCioId(pObj);
      sprintf(Saig_ObjName::Buffer,"pi%0*d",(ulong)uVar2,(ulong)uVar3);
    }
  }
  else {
    uVar2 = Aig_ManObjNumMax(p);
    uVar2 = Abc_Base10Log(uVar2);
    uVar3 = Aig_ObjId(pObj);
    sprintf(Saig_ObjName::Buffer,"n%0*d",(ulong)uVar2,(ulong)uVar3);
  }
  return Saig_ObjName::Buffer;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
char * Saig_ObjName( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    static char Buffer[16];
    if ( Aig_ObjIsNode(pObj) || Aig_ObjIsConst1(pObj) )
        sprintf( Buffer, "n%0*d", Abc_Base10Log(Aig_ManObjNumMax(p)), Aig_ObjId(pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        sprintf( Buffer, "pi%0*d", Abc_Base10Log(Saig_ManPiNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsPo(p, pObj) )
        sprintf( Buffer, "po%0*d", Abc_Base10Log(Saig_ManPoNum(p)), Aig_ObjCioId(pObj) );
    else if ( Saig_ObjIsLo(p, pObj) )
        sprintf( Buffer, "lo%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPiNum(p) );
    else if ( Saig_ObjIsLi(p, pObj) )
        sprintf( Buffer, "li%0*d", Abc_Base10Log(Saig_ManRegNum(p)), Aig_ObjCioId(pObj) - Saig_ManPoNum(p) );
    else 
        assert( 0 );
    return Buffer;
}